

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

void __thiscall
toml::basic_value<toml::type_config>::basic_value
          (void *param_1,undefined4 param_2,undefined8 param_3,region *param_4)

{
  region *this;
  
  *(undefined1 *)param_1 = 7;
  toml::detail::value_with_format<toml::local_date,_toml::local_date_format_info>::value_with_format
            ((value_with_format<toml::local_date,_toml::local_date_format_info> *)
             ((long)param_1 + 8),param_2);
  this = (region *)((long)param_1 + 0x48);
  toml::detail::region::region(this,param_4);
  preserve_comments::preserve_comments
            ((preserve_comments *)this,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)param_4);
  return;
}

Assistant:

basic_value(local_date_type x, local_date_format_info fmt,
                std::vector<std::string> com, region_type reg)
        : type_(value_t::local_date), local_date_(local_date_storage(x, fmt)),
          region_(std::move(reg)), comments_(std::move(com))
    {}